

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_goto_parent(coda_cursor *cursor)

{
  coda_cursor *cursor_local;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x530);
    cursor_local._4_4_ = -1;
  }
  else if (cursor->n < 2) {
    coda_set_error(-0x6c,(char *)0x0);
    cursor_local._4_4_ = -1;
  }
  else {
    cursor->n = cursor->n + -1;
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_goto_parent(coda_cursor *cursor)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (cursor->n <= 1)
    {
        coda_set_error(CODA_ERROR_NO_PARENT, NULL);
        return -1;
    }

    cursor->n--;

    return 0;
}